

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

void vkt::ubo::anon_unknown_0::generateValues
               (UniformLayout *layout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *blockPointers,deUint32 seed)

{
  size_type sVar1;
  pointer ppVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  const_reference entry_00;
  UniformLayoutEntry *entry;
  int entryNdx;
  int numEntries;
  _Rb_tree_const_iterator<std::pair<const_int,_void_*>_> local_48;
  void *local_40;
  void *basePtr;
  int local_30;
  int blockNdx;
  int numBlocks;
  Random rnd;
  deUint32 seed_local;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  *blockPointers_local;
  UniformLayout *layout_local;
  
  rnd.m_rnd.z = seed;
  unique0x10000129 = blockPointers;
  de::Random::Random((Random *)&blockNdx,seed);
  sVar1 = std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>::size
                    (&layout->blocks);
  local_30 = (int)sVar1;
  for (basePtr._4_4_ = 0; basePtr._4_4_ < local_30; basePtr._4_4_ = basePtr._4_4_ + 1) {
    local_48._M_node =
         (_Base_ptr)
         std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::find
                   (stack0xffffffffffffffe8,(key_type_conflict *)((long)&basePtr + 4));
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_void_*>_>::operator->(&local_48);
    local_40 = ppVar2->second;
    pvVar3 = std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>::
             operator[](&layout->blocks,(long)basePtr._4_4_);
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&pvVar3->activeUniformIndices);
    for (entry._4_4_ = 0; entry._4_4_ < (int)sVar1; entry._4_4_ = entry._4_4_ + 1) {
      pvVar3 = std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
               ::operator[](&layout->blocks,(long)basePtr._4_4_);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&pvVar3->activeUniformIndices,(long)entry._4_4_);
      entry_00 = std::
                 vector<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                 ::operator[](&layout->uniforms,(long)*pvVar4);
      generateValue(entry_00,local_40,(Random *)&blockNdx);
    }
  }
  de::Random::~Random((Random *)&blockNdx);
  return;
}

Assistant:

void generateValues (const UniformLayout& layout, const std::map<int, void*>& blockPointers, deUint32 seed)
{
	de::Random	rnd			(seed);
	int			numBlocks	= (int)layout.blocks.size();

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		void*	basePtr		= blockPointers.find(blockNdx)->second;
		int		numEntries	= (int)layout.blocks[blockNdx].activeUniformIndices.size();

		for (int entryNdx = 0; entryNdx < numEntries; entryNdx++)
		{
			const UniformLayoutEntry& entry = layout.uniforms[layout.blocks[blockNdx].activeUniformIndices[entryNdx]];
			generateValue(entry, basePtr, rnd);
		}
	}
}